

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_impl_avx2.c
# Opt level: O2

uint aom_sad64x128_avg_avx2
               (uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride,uint8_t *second_pred
               )

{
  int in_EAX;
  uint uVar1;
  uint uVar2;
  
  uVar1 = sad_w64_avg_avx2(src_ptr,src_stride,ref_ptr,ref_stride,(int)second_pred,(uint8_t *)0x40,
                           in_EAX);
  uVar2 = sad_w64_avg_avx2(src_ptr + (src_stride << 6),src_stride,ref_ptr + (ref_stride << 6),
                           ref_stride,(int)second_pred + 0x1000,(uint8_t *)0x40,in_EAX);
  return uVar2 + uVar1;
}

Assistant:

unsigned int aom_sad64x128_avg_avx2(const uint8_t *src_ptr, int src_stride,
                                    const uint8_t *ref_ptr, int ref_stride,
                                    const uint8_t *second_pred) {
  uint32_t sum = sad_w64_avg_avx2(src_ptr, src_stride, ref_ptr, ref_stride, 64,
                                  second_pred, 64);
  src_ptr += src_stride << 6;
  ref_ptr += ref_stride << 6;
  second_pred += 64 << 6;
  sum += sad_w64_avg_avx2(src_ptr, src_stride, ref_ptr, ref_stride, 64,
                          second_pred, 64);
  return sum;
}